

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_get.cpp
# Opt level: O3

idx_t __thiscall duckdb::LogicalGet::EstimateCardinality(LogicalGet *this,ClientContext *context)

{
  bool bVar1;
  table_function_cardinality_t p_Var2;
  int iVar3;
  __uniq_ptr_impl<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_> in_RAX;
  pointer pNVar4;
  reference this_00;
  pointer pLVar5;
  undefined4 extraout_var;
  pointer *__ptr;
  undefined1 *puVar6;
  idx_t iVar7;
  _Head_base<0UL,_duckdb::NodeStatistics_*,_false> local_28;
  
  puVar6 = (undefined1 *)&stack0xffffffffffffffd8;
  if ((this->super_LogicalOperator).has_estimated_cardinality == true) {
    iVar7 = (this->super_LogicalOperator).estimated_cardinality;
  }
  else {
    p_Var2 = (this->function).cardinality;
    if ((p_Var2 != (table_function_cardinality_t)0x0) &&
       (local_28._M_head_impl =
             (NodeStatistics *)
             in_RAX._M_t.
             super__Tuple_impl<0UL,_duckdb::NodeStatistics_*,_std::default_delete<duckdb::NodeStatistics>_>
             .super__Head_base<0UL,_duckdb::NodeStatistics_*,_false>._M_head_impl,
       (*p_Var2)((ClientContext *)&stack0xffffffffffffffd8,(FunctionData *)context),
       (__uniq_ptr_data<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true,_true>
        )local_28._M_head_impl !=
       (tuple<duckdb::NodeStatistics_*,_std::default_delete<duckdb::NodeStatistics>_>)0x0)) {
      pNVar4 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
               ::operator->((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                             *)&stack0xffffffffffffffd8);
      bVar1 = pNVar4->has_estimated_cardinality;
      if (bVar1 == true) {
        pNVar4 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                 ::operator->((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                               *)&stack0xffffffffffffffd8);
        puVar6 = (undefined1 *)pNVar4->estimated_cardinality;
      }
      if ((tuple<duckdb::NodeStatistics_*,_std::default_delete<duckdb::NodeStatistics>_>)
          local_28._M_head_impl != (_Head_base<0UL,_duckdb::NodeStatistics_*,_false>)0x0) {
        operator_delete(local_28._M_head_impl);
      }
      if (bVar1 != false) {
        return (idx_t)puVar6;
      }
    }
    if ((this->super_LogicalOperator).children.
        super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->super_LogicalOperator).children.
        super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      iVar7 = 1;
    }
    else {
      this_00 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                ::operator[](&(this->super_LogicalOperator).children,0);
      pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(this_00);
      iVar3 = (*pLVar5->_vptr_LogicalOperator[7])(pLVar5,context);
      iVar7 = CONCAT44(extraout_var,iVar3);
    }
  }
  return iVar7;
}

Assistant:

idx_t LogicalGet::EstimateCardinality(ClientContext &context) {
	// join order optimizer does better cardinality estimation.
	if (has_estimated_cardinality) {
		return estimated_cardinality;
	}
	if (function.cardinality) {
		auto node_stats = function.cardinality(context, bind_data.get());
		if (node_stats && node_stats->has_estimated_cardinality) {
			return node_stats->estimated_cardinality;
		}
	}
	if (!children.empty()) {
		return children[0]->EstimateCardinality(context);
	}
	return 1;
}